

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::Option(ParsedScene *this,string *name,string *value,FileLoc loc)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *this_00;
  string nName;
  string local_40 [32];
  
  anon_unknown_163::normalizeArg(&nName,name);
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[7]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [7])"Option");
    goto LAB_002895de;
  }
  bVar1 = std::operator==(&nName,"disablepixeljitter");
  if (bVar1) {
    bVar1 = std::operator==(value,"true");
    if (bVar1) {
      *(undefined1 *)(Options + 0xc) = 1;
      goto LAB_002895de;
    }
    bVar1 = std::operator==(value,"false");
    if (bVar1) {
      *(undefined1 *)(Options + 0xc) = 0;
      goto LAB_002895de;
    }
LAB_002895c7:
    pcVar3 = "%s: expected \"true\" or \"false\" for option value";
  }
  else {
    bVar1 = std::operator==(&nName,"disablewavelengthjitter");
    if (bVar1) {
      bVar1 = std::operator==(value,"true");
      if (bVar1) {
        *(undefined1 *)(Options + 0xd) = 1;
        goto LAB_002895de;
      }
      bVar1 = std::operator==(value,"false");
      if (bVar1) {
        *(undefined1 *)(Options + 0xd) = 0;
        goto LAB_002895de;
      }
      goto LAB_002895c7;
    }
    bVar1 = std::operator==(&nName,"msereferenceimage");
    if (bVar1) {
      if (((value->_M_string_length < 3) || (pcVar3 = (value->_M_dataplus)._M_p, *pcVar3 != '\"'))
         || (pcVar3[value->_M_string_length - 1] != '\"')) {
        (this->super_SceneRepresentation).errorExit = true;
        Error<std::__cxx11::string_const&>(&loc,"%s: expected quoted string for option value",value)
        ;
      }
      std::__cxx11::string::substr((ulong)local_40,(ulong)value);
      this_00 = (string *)(Options + 0x48);
LAB_002894b9:
      std::__cxx11::string::operator=(this_00,local_40);
      std::__cxx11::string::~string(local_40);
      goto LAB_002895de;
    }
    bVar1 = std::operator==(&nName,"msereferenceout");
    if (bVar1) {
      if (((value->_M_string_length < 3) || (pcVar3 = (value->_M_dataplus)._M_p, *pcVar3 != '\"'))
         || (pcVar3[value->_M_string_length - 1] != '\"')) {
        (this->super_SceneRepresentation).errorExit = true;
        Error<std::__cxx11::string_const&>(&loc,"%s: expected quoted string for option value",value)
        ;
      }
      std::__cxx11::string::substr((ulong)local_40,(ulong)value);
      this_00 = (string *)(Options + 0x68);
      goto LAB_002894b9;
    }
    bVar1 = std::operator==(&nName,"seed");
    if (bVar1) {
      iVar2 = atoi((value->_M_dataplus)._M_p);
      *(int *)(Options + 4) = iVar2;
      goto LAB_002895de;
    }
    bVar1 = std::operator==(&nName,"forcediffuse");
    if (bVar1) {
      bVar1 = std::operator==(value,"true");
      if (bVar1) {
        *(undefined1 *)(Options + 0xe) = 1;
        goto LAB_002895de;
      }
      bVar1 = std::operator==(value,"false");
      if (bVar1) {
        *(undefined1 *)(Options + 0xe) = 0;
        goto LAB_002895de;
      }
      goto LAB_002895c7;
    }
    bVar1 = std::operator==(&nName,"pixelstats");
    if (bVar1) {
      bVar1 = std::operator==(value,"true");
      if (bVar1) {
        *(undefined1 *)(Options + 10) = 1;
        goto LAB_002895de;
      }
      bVar1 = std::operator==(value,"false");
      if (bVar1) {
        *(undefined1 *)(Options + 10) = 0;
        goto LAB_002895de;
      }
      goto LAB_002895c7;
    }
    pcVar3 = "%s: unknown option";
    value = name;
  }
  (this->super_SceneRepresentation).errorExit = true;
  Error<std::__cxx11::string_const&>(&loc,pcVar3,value);
LAB_002895de:
  std::__cxx11::string::~string((string *)&nName);
  return;
}

Assistant:

void ParsedScene::Option(const std::string &name, const std::string &value, FileLoc loc) {
    std::string nName = normalizeArg(name);

    VERIFY_INITIALIZED("Option");
    if (nName == "disablepixeljitter") {
        if (value == "true")
            Options->disablePixelJitter = true;
        else if (value == "false")
            Options->disablePixelJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disablewavelengthjitter") {
        if (value == "true")
            Options->disableWavelengthJitter = true;
        else if (value == "false")
            Options->disableWavelengthJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "msereferenceimage") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceImage = value.substr(1, value.size() - 2);
    } else if (nName == "msereferenceout") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceOutput = value.substr(1, value.size() - 2);
    } else if (nName == "seed") {
        Options->seed = std::atoi(value.c_str());
    } else if (nName == "forcediffuse") {
        if (value == "true")
            Options->forceDiffuse = true;
        else if (value == "false")
            Options->forceDiffuse = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "pixelstats") {
        if (value == "true")
            Options->recordPixelStatistics = true;
        else if (value == "false")
            Options->recordPixelStatistics = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else
        ErrorExitDeferred(&loc, "%s: unknown option", name);
}